

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

Gia_Man_t * Acec_DetectAdditional(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *vRootXorSet_00;
  abctime aVar3;
  Vec_Int_t *vRootXorSet;
  Gia_Man_t *pNew;
  abctime clk;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  Abc_Clock();
  aVar2 = Abc_Clock();
  vRootXorSet_00 = Acec_CollectXorTops(p);
  if (vRootXorSet_00 == (Vec_Int_t *)0x0) {
    vRootXorSet = (Vec_Int_t *)Gia_ManDup(p);
  }
  else {
    Acec_DetectComputeSupports(p,vRootXorSet_00);
    vRootXorSet = (Vec_Int_t *)Acec_DetectXorBuildNew(p,vRootXorSet_00);
    Vec_IntFree(vRootXorSet_00);
  }
  iVar1 = Vec_IntSize(vRootXorSet_00);
  printf("Detected %d top XORs.  ",(long)iVar1 / 4 & 0xffffffff,(long)iVar1 % 4 & 0xffffffff);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return (Gia_Man_t *)vRootXorSet;
}

Assistant:

Gia_Man_t * Acec_DetectAdditional( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vRootXorSet;
//    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );

    //Ree_ManPrintAdders( vAdds, 1 );
//    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vRootXorSet = Acec_CollectXorTops( p );
    if ( vRootXorSet )
    {
        Acec_DetectComputeSupports( p, vRootXorSet );

        pNew = Acec_DetectXorBuildNew( p, vRootXorSet );
        Vec_IntFree( vRootXorSet );
    }
    else
        pNew = Gia_ManDup( p );

    printf( "Detected %d top XORs.  ", Vec_IntSize(vRootXorSet)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

//    Vec_IntFree( vXors );
//    Vec_IntFree( vAdds );
    return pNew;
}